

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  char *pcVar2;
  cmMessenger *messenger;
  undefined1 local_a0 [8];
  cmListFile listFile;
  ListFileScope scope;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string filenametoread;
  char *filename_local;
  cmMakefile *this_local;
  
  filenametoread.field_2._8_8_ = filename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,filename,&local_61);
  pcVar2 = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath((string *)local_40,&local_60,pcVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ListFileScope::ListFileScope
            ((ListFileScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,(string *)local_40);
  cmListFile::cmListFile((cmListFile *)local_a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_a0,pcVar2,messenger,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)local_a0,(string *)local_40);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      ListFileScope::Quiet
                ((ListFileScope *)
                 &listFile.Functions.
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  cmListFile::~cmListFile((cmListFile *)local_a0);
  ListFileScope::~ListFileScope
            ((ListFileScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }
  return true;
}